

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O1

int run_test_pipe_getsockname_blocking(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_pipe_getsockname_blocking_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_getsockname_blocking) {
#ifdef _WIN32
  HANDLE readh, writeh;
  int readfd;
  char buf1[1024], buf2[1024];
  size_t len1, len2;
  int r;

  r = CreatePipe(&readh, &writeh, NULL, 65536);
  ASSERT(r != 0);

  r = uv_pipe_init(uv_default_loop(), &pipe_client, 0);
  ASSERT(r == 0);
  readfd = _open_osfhandle((intptr_t)readh, _O_RDONLY);
  ASSERT(r != -1);
  r = uv_pipe_open(&pipe_client, readfd);
  ASSERT(r == 0);
  r = uv_read_start((uv_stream_t*)&pipe_client, NULL, NULL);
  ASSERT(r == 0);
  Sleep(100);
  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT(r == 0);

  len1 = sizeof buf1;
  r = uv_pipe_getsockname(&pipe_client, buf1, &len1);
  ASSERT(r == 0);
  ASSERT(len1 == 0);  /* It's an annonymous pipe. */

  r = uv_read_start((uv_stream_t*)&pipe_client, NULL, NULL);
  ASSERT(r == 0);
  Sleep(100);

  len2 = sizeof buf2;
  r = uv_pipe_getsockname(&pipe_client, buf2, &len2);
  ASSERT(r == 0);
  ASSERT(len2 == 0);  /* It's an annonymous pipe. */

  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT(r == 0);

  ASSERT(len1 == len2);
  ASSERT(memcmp(buf1, buf2, len1) == 0);

  pipe_close_cb_called = 0;
  uv_close((uv_handle_t*)&pipe_client, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(pipe_close_cb_called == 1);

  CloseHandle(writeh);
#endif

  MAKE_VALGRIND_HAPPY();
  return 0;
}